

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O3

void __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::Fail
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this,HRESULT error)

{
  bool isBody;
  code *pcVar1;
  bool bVar2;
  ParseError *this_00;
  undefined4 *puVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  
  this_00 = (ParseError *)__cxa_allocate_exception(0x10);
  isBody = this->inBody;
  uVar6 = (long)this->next - (long)this->input;
  if (this->next < this->input || 0x7ffffffe < (long)uVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                       ,0x37,"(ph >= pl && ph - pl <= MaxCharCount)",
                       "ph >= pl && ph - pl <= MaxCharCount");
    if (!bVar2) goto LAB_00ec2b3f;
    *puVar3 = 0;
  }
  uVar5 = (this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits;
  if ((uVar6 & 0xffffffff) < uVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xb0,"(nextOffset >= this->m_cMultiUnits)",
                       "nextOffset >= this->m_cMultiUnits");
    if (!bVar2) goto LAB_00ec2b3f;
    *puVar3 = 0;
    uVar5 = (this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits;
  }
  lVar4 = (long)this->next - (long)this->input;
  if (this->next < this->input || 0x7ffffffe < lVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                       ,0x37,"(ph >= pl && ph - pl <= MaxCharCount)",
                       "ph >= pl && ph - pl <= MaxCharCount");
    if (!bVar2) {
LAB_00ec2b3f:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  ParseError::ParseError(this_00,isBody,(int)uVar6 - (int)uVar5,(CharCount)lVar4,error);
  __cxa_throw(this_00,&ParseError::typeinfo,0);
}

Assistant:

void Parser<P, IsLiteral>::Fail(HRESULT error)
    {
        throw ParseError(inBody, Pos(), Chars<EncodedChar>::OSB(next, input), error);
    }